

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

SN_ELEMENT * __thiscall
ON_SerialNumberMap::RemoveId(ON_SerialNumberMap *this,ON__UINT64 sn,ON_UUID id)

{
  long lVar1;
  SN_ELEMENT *e;
  long lVar2;
  ON__UINT32 OVar3;
  SN_ELEMENT **ppSVar4;
  SN_ELEMENT *pSVar5;
  SN_ELEMENT **ppSVar6;
  ON_UUID id_local;
  
  id_local.Data4 = id.Data4;
  id_local._0_8_ = id._0_8_;
  if (((this->m_active_id_count != 0) && (id_local._0_8_ != 0 || id_local.Data4 != (uchar  [8])0x0))
     && ((lVar1._0_4_ = (this->m_inactive_id).Data1, lVar1._4_2_ = (this->m_inactive_id).Data2,
         lVar1._6_2_ = (this->m_inactive_id).Data3, lVar1 != id_local._0_8_ ||
         (*&(this->m_inactive_id).Data4 != id_local.Data4)))) {
    if (this->m_bHashTableIsValid == '\0') {
      if (sn == 0) {
        pSVar5 = Internal_HashTableFindId(this,id,0,false);
      }
      else {
        pSVar5 = FindSerialNumber(this,sn);
      }
      if (pSVar5 != (SN_ELEMENT *)0x0) {
        pSVar5 = Internal_HashTableRemoveElement(this,pSVar5,true);
        return pSVar5;
      }
      Internal_HashTableBuild(this);
    }
    OVar3 = IdCRC32(&id_local);
    ppSVar6 = (SN_ELEMENT **)
              ((ulong)(uint)((int)(((ulong)OVar3 / 0xffa) % 0xffa) << 3) +
              (long)this->m_hash_table_blocks[(ulong)OVar3 % (ulong)this->m_hash_block_count]);
    pSVar5 = (SN_ELEMENT *)0x0;
    ppSVar4 = ppSVar6;
    while (e = *ppSVar4, e != (SN_ELEMENT *)0x0) {
      lVar2._0_4_ = (e->m_id).Data1;
      lVar2._4_2_ = (e->m_id).Data2;
      lVar2._6_2_ = (e->m_id).Data3;
      if ((lVar2 == id_local._0_8_) && (*&(e->m_id).Data4 == id_local.Data4)) {
        ppSVar4 = &pSVar5->m_next;
        if (pSVar5 == (SN_ELEMENT *)0x0) {
          ppSVar4 = ppSVar6;
        }
        *ppSVar4 = e->m_next;
        pSVar5 = Internal_HashTableRemoveElement(this,e,false);
        return pSVar5;
      }
      pSVar5 = e;
      ppSVar4 = &e->m_next;
    }
  }
  return (SN_ELEMENT *)0x0;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* 
ON_SerialNumberMap::RemoveId(ON__UINT64 sn, ON_UUID id)
{
  if ( m_active_id_count > 0 && IdIsNotNil(&id) && IdIsNotEqual(&id,&m_inactive_id))
  {
    struct SN_ELEMENT* e;
    if ( false == m_bHashTableIsValid )
    {
      if (sn > 0)
      {
        // We can avoid rebuilding the hash table.
        // Use the serial number to find the element.
        e = FindSerialNumber(sn);
        if (nullptr != e)
          return Internal_HashTableRemoveElement(e,true);
      }
      else
      {
        // check most recently added elements
        e = Internal_HashTableFindId(id, 0, false);
        if (nullptr != e)
        {
          // got lucky
          return Internal_HashTableRemoveElement(e,true);
        }
      }
      
      // have to build hash table (expensive)
      Internal_HashTableBuild();
    }

    const ON__UINT32 id_crc32 = IdCRC32(&id);
    struct SN_ELEMENT** hash_table_block = Internal_HashTableBlock(id_crc32);
    const ON__UINT32 hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(id_crc32);
    struct SN_ELEMENT* prev = nullptr;
    for (e = hash_table_block[hash_i]; nullptr != e; e = e->m_next)
    {
      if ( IdIsEqual(&e->m_id,&id) )
      {
        if (nullptr != prev)
          prev->m_next = e->m_next;
        else
          hash_table_block[hash_i] = e->m_next;
        return Internal_HashTableRemoveElement(e,false);
      }
      prev = e;
    }
  }

  return nullptr;
}